

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopFocusScope(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  uint *puVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (0 < (GImGui->FocusScopeStack).Size) {
    puVar3 = ImVector<unsigned_int>::back(&GImGui->FocusScopeStack);
    (pIVar1->DC).NavFocusScopeIdCurrent = *puVar3;
    ImVector<unsigned_int>::pop_back(&pIVar2->FocusScopeStack);
    return;
  }
  __assert_fail("g.FocusScopeStack.Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1b45,"void ImGui::PopFocusScope()");
}

Assistant:

void ImGui::PopFocusScope()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.FocusScopeStack.Size > 0); // Too many PopFocusScope() ?
    window->DC.NavFocusScopeIdCurrent = g.FocusScopeStack.back();
    g.FocusScopeStack.pop_back();
}